

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri_encode.cpp
# Opt level: O1

string * cmakels::support::filename_to_uri(string *__return_storage_ptr__,string *filename)

{
  std::operator+(__return_storage_ptr__,"file://",filename);
  return __return_storage_ptr__;
}

Assistant:

std::string filename_to_uri(std::string const &filename) {
#ifdef _WIN32
  auto str = filename;
  std::replace(str.begin(), str.end(), '\\', '/');
  support::replace_all(str, ":", "%3A");
  return "file:///" + str;
#else
  return "file://" + filename;
#endif
}